

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# socks5_auth_manager.c
# Opt level: O3

int s5auth_manager_register_username_password_authenticator
              (s5auth_manager *auth_manager,identity *identities,size_t n)

{
  int iVar1;
  identity *piVar2;
  int *piVar3;
  char *pcVar4;
  size_t sVar5;
  long lVar6;
  
  piVar2 = (identity *)calloc(n,0x1fe);
  auth_manager->identities = piVar2;
  if (piVar2 == (identity *)0x0) {
    piVar3 = __errno_location();
    pcVar4 = strerror(*piVar3);
    ymlog(3,"socks5_auth_manager.c",0x29,"s5auth_manager_register_username_password_authenticator",
          "calloc() for struct identity failed: %s (errno=%d)",pcVar4,*piVar3);
    iVar1 = -1;
  }
  else {
    if (n != 0) {
      lVar6 = 0;
      sVar5 = n;
      do {
        strcpy(auth_manager->identities->username + lVar6,identities->username);
        strcpy(auth_manager->identities->password + lVar6,identities->password);
        identities = identities + 1;
        lVar6 = lVar6 + 0x1fe;
        sVar5 = sVar5 - 1;
      } while (sVar5 != 0);
    }
    auth_manager->identities_size = n;
    auth_manager->username_password_authenticator_enabled = 1;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int s5auth_manager_register_username_password_authenticator(struct s5auth_manager *auth_manager,
        struct identity *identities, size_t n)
{
    auth_manager->identities = calloc(n, sizeof(struct identity));
    if (auth_manager->identities == NULL) {
        error("calloc() for struct identity failed: %s (errno=%d)", strerror(errno), errno);
        return -1;
    }
    size_t i;
    for (i = 0; i < n; i++) {
        strcpy(auth_manager->identities[i].username, identities[i].username);
        strcpy(auth_manager->identities[i].password, identities[i].password);
    }
    auth_manager->identities_size = n;
    auth_manager->username_password_authenticator_enabled = 1;
    return 0;
}